

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O1

BoxArray * amrex::intersect(BoxArray *__return_storage_ptr__,BoxArray *ba,Box *b,IntVect *ng)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  undefined1 local_49;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_48;
  unsigned_long local_28;
  
  local_48.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BoxArray::intersections(ba,b,&local_48,false,ng);
  uVar3 = (uint)((ulong)((long)local_48.
                               super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_48.
                              super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
  local_28 = (unsigned_long)(int)uVar3;
  (__return_storage_ptr__->m_bat).m_bat_type = null;
  (__return_storage_ptr__->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<amrex::BARef,std::allocator<amrex::BARef>,unsigned_long&>
            (&(__return_storage_ptr__->m_ref).
              super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (BARef **)&__return_storage_ptr__->m_ref,(allocator<amrex::BARef> *)&local_49,&local_28
            );
  (__return_storage_ptr__->m_simplified_list).
  super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->m_simplified_list).
  super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (0 < (int)uVar3) {
    lVar1 = 4;
    uVar2 = 0;
    do {
      BoxArray::set(__return_storage_ptr__,(int)uVar2,
                    (Box *)((long)((local_48.
                                    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->second).smallend.
                                  vect + lVar1 + -4));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x20;
    } while ((uVar3 & 0x7fffffff) != uVar2);
  }
  if (local_48.
      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

BoxArray
intersect (const BoxArray& ba,
           const Box&      b,
           const IntVect&  ng)
{
    std::vector< std::pair<int,Box> > isects;

    ba.intersections(b,isects,false,ng);

    const int N = isects.size();

    BoxArray r(N);

    if (N > 0) {
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
        for (int i = 0; i < N; i++)
        {
            r.set(i, isects[i].second);
        }
    }

    return r;
}